

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoreClient.cpp
# Opt level: O0

bool ViconDataStreamSDK::Core::anon_unknown_11::GetSampleCount<ViconCGStream::VMomentFrame>
               (vector<ViconCGStream::VMomentFrame,_std::allocator<ViconCGStream::VMomentFrame>_>
                *i_rFrames,VChannelInfo *i_rChannel,UInt64 i_DevicePeriod,UInt64 i_DeviceStartTick,
               TPeriod *i_rFramePeriod,uint *o_rCount)

{
  bool bVar1;
  uint uVar2;
  size_type sVar3;
  reference pVVar4;
  size_type sVar5;
  Int64 SamplePeriod;
  size_t NumSamples;
  size_t NumberOfSampleComponents;
  VMomentFrame *rFrame;
  size_t Components;
  const_iterator End;
  const_iterator It;
  uint *o_rCount_local;
  TPeriod *i_rFramePeriod_local;
  UInt64 i_DeviceStartTick_local;
  UInt64 i_DevicePeriod_local;
  VChannelInfo *i_rChannel_local;
  vector<ViconCGStream::VMomentFrame,_std::allocator<ViconCGStream::VMomentFrame>_> *i_rFrames_local
  ;
  
  End = std::vector<ViconCGStream::VMomentFrame,_std::allocator<ViconCGStream::VMomentFrame>_>::
        begin(i_rFrames);
  Components = (size_t)std::
                       vector<ViconCGStream::VMomentFrame,_std::allocator<ViconCGStream::VMomentFrame>_>
                       ::end(i_rFrames);
  *o_rCount = 0;
  sVar3 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(&i_rChannel->m_ComponentNames);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&End,(__normal_iterator<const_ViconCGStream::VMomentFrame_*,_std::vector<ViconCGStream::VMomentFrame,_std::allocator<ViconCGStream::VMomentFrame>_>_>
                             *)&Components);
    if (!bVar1) {
      return false;
    }
    pVVar4 = __gnu_cxx::
             __normal_iterator<const_ViconCGStream::VMomentFrame_*,_std::vector<ViconCGStream::VMomentFrame,_std::allocator<ViconCGStream::VMomentFrame>_>_>
             ::operator*(&End);
    sVar5 = std::vector<float,_std::allocator<float>_>::size(&pVVar4->m_Samples);
    if ((((pVVar4->m_DeviceID == i_rChannel->m_DeviceID) &&
         (pVVar4->m_ChannelID == i_rChannel->m_ChannelID)) && (sVar3 <= sVar5)) && (sVar3 != 0))
    break;
    __gnu_cxx::
    __normal_iterator<const_ViconCGStream::VMomentFrame_*,_std::vector<ViconCGStream::VMomentFrame,_std::allocator<ViconCGStream::VMomentFrame>_>_>
    ::operator++(&End);
  }
  if (sVar5 % sVar3 == 0) {
    if (i_DevicePeriod % (sVar5 / sVar3) == 0) {
      uVar2 = anon_unknown.dwarf_9508b::GetSamplesInFrame
                        (i_rFramePeriod,i_DeviceStartTick,i_DevicePeriod / (sVar5 / sVar3));
      *o_rCount = uVar2;
      return true;
    }
    __assert_fail("i_DevicePeriod % NumSamples == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/whoenig[P]vicon-datastream-sdk/Vicon/CrossMarket/DataStream/ViconDataStreamSDKCore/CoreClient.cpp"
                  ,0xef1,
                  "bool ViconDataStreamSDK::Core::(anonymous namespace)::GetSampleCount(const std::vector<TFrame> &, const ViconCGStream::VChannelInfo &, const ViconCGStreamType::UInt64, const ViconCGStreamType::UInt64, const TPeriod &, unsigned int &) [TFrame = ViconCGStream::VMomentFrame]"
                 );
  }
  __assert_fail("NumberOfSampleComponents % Components == 0",
                "/workspace/llm4binary/github/license_c_cmakelists/whoenig[P]vicon-datastream-sdk/Vicon/CrossMarket/DataStream/ViconDataStreamSDKCore/CoreClient.cpp"
                ,0xeed,
                "bool ViconDataStreamSDK::Core::(anonymous namespace)::GetSampleCount(const std::vector<TFrame> &, const ViconCGStream::VChannelInfo &, const ViconCGStreamType::UInt64, const ViconCGStreamType::UInt64, const TPeriod &, unsigned int &) [TFrame = ViconCGStream::VMomentFrame]"
               );
}

Assistant:

bool GetSampleCount( const std::vector< TFrame > & i_rFrames,
                       const ViconCGStream::VChannelInfo & i_rChannel,
                       const ViconCGStreamType::UInt64 i_DevicePeriod,
                       const ViconCGStreamType::UInt64 i_DeviceStartTick,
                       const TPeriod               & i_rFramePeriod,
                             unsigned int          & o_rCount )
  {
    typename std::vector< TFrame >::const_iterator It  = i_rFrames.begin();
    typename std::vector< TFrame >::const_iterator End = i_rFrames.end();
    o_rCount = 0;
    const size_t Components = i_rChannel.m_ComponentNames.size();
    for( ; It != End ; ++It )
    {
      const TFrame & rFrame( *It );
      const size_t NumberOfSampleComponents = rFrame.m_Samples.size();
      if( rFrame.m_DeviceID       == i_rChannel.m_DeviceID  &&
          rFrame.m_ChannelID      == i_rChannel.m_ChannelID &&
          NumberOfSampleComponents >= Components &&
          Components != 0 )
      {
        assert( NumberOfSampleComponents % Components == 0 );

        const size_t NumSamples = NumberOfSampleComponents / Components;

        assert( i_DevicePeriod % NumSamples == 0 );
        const ViconCGStreamType::Int64 SamplePeriod = i_DevicePeriod / NumSamples;

        o_rCount = GetSamplesInFrame( i_rFramePeriod, i_DeviceStartTick, SamplePeriod );
        return true;
      }
    }
    return false;
  }